

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

CBlockIndex * __thiscall ChainstateManager::GetBackgroundSyncTip(ChainstateManager *this)

{
  long lVar1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  pointer ppCVar3;
  bool bVar4;
  CBlockIndex *pCVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = BackgroundSyncInProgress(this);
  if ((bVar4) &&
     (_Var2._M_head_impl =
           (this->m_ibd_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
     ppCVar3 = *(pointer *)((long)&(_Var2._M_head_impl)->m_chain + 8),
     ppCVar3 != *(pointer *)&((_Var2._M_head_impl)->m_chain).vChain)) {
    pCVar5 = ppCVar3[0xffffffffffffffff];
  }
  else {
    pCVar5 = (CBlockIndex *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar5;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(GetMutex()) {
        return BackgroundSyncInProgress() ? m_ibd_chainstate->m_chain.Tip() : nullptr;
    }